

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O1

bool __thiscall QCompletionModel::hasChildren(QCompletionModel *this,QModelIndex *parent)

{
  long lVar1;
  long *plVar2;
  QCompletionEngine *pQVar3;
  undefined1 uVar4;
  int iVar5;
  int iVar6;
  long in_FS_OFFSET;
  undefined1 local_40 [24];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  if (((parent->r < 0) || (parent->c < 0)) || ((parent->m).ptr == (QAbstractItemModel *)0x0)) {
    if (this->showAll == true) {
      QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
      ::value((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
               *)(lVar1 + 0xd8));
      plVar2 = *(long **)(lVar1 + 0xd8);
      (**(code **)(*(long *)this + 400))(local_40,this,parent);
      uVar4 = (**(code **)(*plVar2 + 0x88))(plVar2,local_40);
    }
    else {
      pQVar3 = (this->engine).d;
      if ((pQVar3->curMatch).indices.v == true) {
        iVar5 = (int)(pQVar3->curMatch).indices.vector.d.size;
      }
      else {
        iVar5 = ((pQVar3->curMatch).indices.t - (pQVar3->curMatch).indices.f) + 1;
      }
      if ((pQVar3->historyMatch).indices.v == true) {
        iVar6 = (int)(pQVar3->historyMatch).indices.vector.d.size;
      }
      else {
        iVar6 = ((pQVar3->historyMatch).indices.t - (pQVar3->historyMatch).indices.f) + 1;
      }
      uVar4 = iVar6 + iVar5 != 0;
    }
  }
  else {
    uVar4 = 0;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (bool)uVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool QCompletionModel::hasChildren(const QModelIndex &parent) const
{
    Q_D(const QCompletionModel);
    if (parent.isValid())
        return false;

    if (showAll)
        return d->model->hasChildren(mapToSource(parent));

    if (!engine->matchCount())
        return false;

    return true;
}